

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPrograms.hpp
# Opt level: O0

ProgramSources * __thiscall
vk::ProgramCollection<glu::ProgramSources>::add
          (ProgramCollection<glu::ProgramSources> *this,string *name)

{
  mapped_type pPVar1;
  ProgramSources *pPVar2;
  mapped_type *ppPVar3;
  undefined1 local_28 [8];
  MovePtr<glu::ProgramSources,_de::DefaultDeleter<glu::ProgramSources>_> prog;
  string *name_local;
  ProgramCollection<glu::ProgramSources> *this_local;
  
  prog.super_UniqueBase<glu::ProgramSources,_de::DefaultDeleter<glu::ProgramSources>_>.m_data._8_8_
       = name;
  de::details::newMovePtr<glu::ProgramSources>();
  pPVar2 = de::details::UniqueBase<glu::ProgramSources,_de::DefaultDeleter<glu::ProgramSources>_>::
           get((UniqueBase<glu::ProgramSources,_de::DefaultDeleter<glu::ProgramSources>_> *)local_28
              );
  ppPVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*>_>_>
            ::operator[](&this->m_programs,
                         (key_type *)
                         prog.
                         super_UniqueBase<glu::ProgramSources,_de::DefaultDeleter<glu::ProgramSources>_>
                         .m_data._8_8_);
  *ppPVar3 = pPVar2;
  de::details::MovePtr<glu::ProgramSources,_de::DefaultDeleter<glu::ProgramSources>_>::release
            ((MovePtr<glu::ProgramSources,_de::DefaultDeleter<glu::ProgramSources>_> *)local_28);
  ppPVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*>_>_>
            ::operator[](&this->m_programs,
                         (key_type *)
                         prog.
                         super_UniqueBase<glu::ProgramSources,_de::DefaultDeleter<glu::ProgramSources>_>
                         .m_data._8_8_);
  pPVar1 = *ppPVar3;
  de::details::MovePtr<glu::ProgramSources,_de::DefaultDeleter<glu::ProgramSources>_>::~MovePtr
            ((MovePtr<glu::ProgramSources,_de::DefaultDeleter<glu::ProgramSources>_> *)local_28);
  return pPVar1;
}

Assistant:

Program& ProgramCollection<Program>::add (const std::string& name)
{
	DE_ASSERT(!contains(name));
	de::MovePtr<Program> prog = de::newMovePtr<Program>();
	m_programs[name] = prog.get();
	prog.release();
	return *m_programs[name];
}